

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_object.cpp
# Opt level: O0

uint ON_IsRhinoApplicationId(ON_UUID id)

{
  bool bVar1;
  uint uVar2;
  undefined1 local_1c [8];
  ON_UUID id_local;
  
  id_local._0_8_ = id.Data4;
  local_1c = id._0_8_;
  bVar1 = operator==(&ON_rhino2_id,(ON_UUID_struct *)local_1c);
  if (bVar1) {
    id_local.Data4[0] = '\x02';
    id_local.Data4[1] = '\0';
    id_local.Data4[2] = '\0';
    id_local.Data4[3] = '\0';
  }
  else {
    bVar1 = operator==(&ON_rhino3_id,(ON_UUID_struct *)local_1c);
    if (bVar1) {
      id_local.Data4[0] = '\x03';
      id_local.Data4[1] = '\0';
      id_local.Data4[2] = '\0';
      id_local.Data4[3] = '\0';
    }
    else {
      bVar1 = operator==(&ON_rhino4_id,(ON_UUID_struct *)local_1c);
      if (bVar1) {
        id_local.Data4[0] = '\x04';
        id_local.Data4[1] = '\0';
        id_local.Data4[2] = '\0';
        id_local.Data4[3] = '\0';
      }
      else {
        bVar1 = operator==(&ON_rhino5_id,(ON_UUID_struct *)local_1c);
        if (bVar1) {
          id_local.Data4[0] = '\x05';
          id_local.Data4[1] = '\0';
          id_local.Data4[2] = '\0';
          id_local.Data4[3] = '\0';
        }
        else {
          bVar1 = operator==(&ON_rhino6_id,(ON_UUID_struct *)local_1c);
          if (bVar1) {
            id_local.Data4[0] = '\x06';
            id_local.Data4[1] = '\0';
            id_local.Data4[2] = '\0';
            id_local.Data4[3] = '\0';
          }
          else {
            bVar1 = operator==(&ON_rhino7_id,(ON_UUID_struct *)local_1c);
            if (bVar1) {
              id_local.Data4[0] = '\a';
              id_local.Data4[1] = '\0';
              id_local.Data4[2] = '\0';
              id_local.Data4[3] = '\0';
            }
            else {
              bVar1 = operator==(&ON_rhino8_id,(ON_UUID_struct *)local_1c);
              if (bVar1) {
                id_local.Data4[0] = '\b';
                id_local.Data4[1] = '\0';
                id_local.Data4[2] = '\0';
                id_local.Data4[3] = '\0';
              }
              else {
                id_local.Data4[0] = '\0';
                id_local.Data4[1] = '\0';
                id_local.Data4[2] = '\0';
                id_local.Data4[3] = '\0';
              }
            }
          }
        }
      }
    }
  }
  uVar2._0_1_ = id_local.Data4[0];
  uVar2._1_1_ = id_local.Data4[1];
  uVar2._2_1_ = id_local.Data4[2];
  uVar2._3_1_ = id_local.Data4[3];
  return uVar2;
}

Assistant:

unsigned int ON_IsRhinoApplicationId(
  ON_UUID id
  )
{
  if (ON_rhino2_id == id)
    return 2;
  if (ON_rhino3_id == id)
    return 3;
  if (ON_rhino4_id == id)
    return 4;
  if (ON_rhino5_id == id)
    return 5;
  if (ON_rhino6_id == id)
    return 6;
  if (ON_rhino7_id == id)
    return 7;
  if (ON_rhino8_id == id)
    return 8;
  return 0;
}